

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger_impl.h
# Opt level: O0

void __thiscall
spdlog::async_logger::_set_formatter(async_logger *this,formatter_ptr *msg_formatter)

{
  pointer this_00;
  shared_ptr<spdlog::formatter> local_28;
  formatter_ptr *local_18;
  formatter_ptr *msg_formatter_local;
  async_logger *this_local;
  
  local_18 = msg_formatter;
  msg_formatter_local = (formatter_ptr *)this;
  std::shared_ptr<spdlog::formatter>::operator=(&(this->super_logger)._formatter,msg_formatter);
  this_00 = std::
            unique_ptr<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
            ::operator->(&this->_async_log_helper);
  std::shared_ptr<spdlog::formatter>::shared_ptr(&local_28,&(this->super_logger)._formatter);
  details::async_log_helper::set_formatter(this_00,&local_28);
  std::shared_ptr<spdlog::formatter>::~shared_ptr(&local_28);
  return;
}

Assistant:

inline void spdlog::async_logger::_set_formatter(spdlog::formatter_ptr msg_formatter)
{
    _formatter = msg_formatter;
    _async_log_helper->set_formatter(_formatter);
}